

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_c.h
# Opt level: O3

void __thiscall
dlib::queue_kernel_c<dlib::queue_kernel_1<dlib::file,dlib::memory_manager_stateless_kernel_1<char>>>
::remove_any(queue_kernel_c<dlib::queue_kernel_1<dlib::file,dlib::memory_manager_stateless_kernel_1<char>>>
             *this)

{
  T *in_RSI;
  
  queue_kernel_c<dlib::queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>_>
  ::remove_any((queue_kernel_c<dlib::queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>_>
                *)(this + -8),in_RSI);
  return;
}

Assistant:

void queue_kernel_c<queue_base>::
    remove_any (
        T& item
    ) 
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( (this->size() > 0),
            "\tvoid queue::remove_any"
            << "\n\tsize() must be greater than zero if something is going to be removed"
            << "\n\tsize(): " << this->size() 
            << "\n\tthis:   " << this
            );

        // call the real function
        queue_base::remove_any(item);
    }